

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte_node.hpp
# Opt level: O0

void __thiscall duckdb::CTENode::CTENode(CTENode *this)

{
  undefined8 *in_RDI;
  QueryNodeType in_stack_0000000f;
  
  QueryNode::QueryNode(&this->super_QueryNode,in_stack_0000000f);
  *in_RDI = &PTR__CTENode_05d041c8;
  ::std::__cxx11::string::string((string *)(in_RDI + 0xf));
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::unique_ptr
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             0x2a501ba);
  unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::unique_ptr
            ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
             0x2a501cb);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)0x2a501dc);
  return;
}

Assistant:

CTENode() : QueryNode(QueryNodeType::CTE_NODE) {
	}